

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void AdditionHelper<unsigned_short,_unsigned_int,_2>::
     AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (unsigned_short *lhs,uint *rhs,unsigned_short *result)

{
  unsigned_short uVar1;
  uint uVar2;
  undefined2 *in_RDX;
  int *in_RSI;
  ushort *in_RDI;
  uint32_t tmp;
  
  uVar2 = (uint)*in_RDI + *in_RSI;
  if (*in_RDI <= uVar2) {
    uVar1 = std::numeric_limits<unsigned_short>::max();
    if (uVar2 <= uVar1) {
      *in_RDX = (short)uVar2;
      return;
    }
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void AdditionThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        //32-bit or less - both are unsigned
        std::uint32_t tmp = (std::uint32_t)lhs + (std::uint32_t)rhs;

        // We added and it didn't get smaller or exceed maxInt
        if( tmp >= lhs && tmp <= std::numeric_limits<T>::max() )
        {
            result = (T)tmp;
            return;
        }
        E::SafeIntOnOverflow();
    }